

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O0

void file_compress(char *file,char *mode)

{
  size_t sVar1;
  FILE *in_00;
  gzFile out_00;
  gzFile out;
  FILE *in;
  char outfile [1024];
  char *mode_local;
  char *file_local;
  
  outfile._1016_8_ = mode;
  sVar1 = strlen(file);
  if (0x3ff < sVar1 + 3) {
    fprintf(_stderr,"%s: filename too long\n",prog);
    exit(1);
  }
  snprintf((char *)&in,0x400,"%s%s",file,".gz");
  in_00 = fopen(file,"rb");
  if (in_00 == (FILE *)0x0) {
    perror(file);
    exit(1);
  }
  out_00 = (gzFile)gzopen(&in,outfile._1016_8_);
  if (out_00 == (gzFile)0x0) {
    fprintf(_stderr,"%s: can\'t gzopen %s\n",prog,&in);
    exit(1);
  }
  gz_compress((FILE *)in_00,out_00);
  unlink(file);
  return;
}

Assistant:

void file_compress(file, mode)
    char  *file;
    char  *mode;
{
    local char outfile[MAX_NAME_LEN];
    FILE  *in;
    gzFile out;

    if (strlen(file) + strlen(GZ_SUFFIX) >= sizeof(outfile)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(outfile, sizeof(outfile), "%s%s", file, GZ_SUFFIX);
#else
    strcpy(outfile, file);
    strcat(outfile, GZ_SUFFIX);
#endif

    in = fopen(file, "rb");
    if (in == NULL) {
        perror(file);
        exit(1);
    }
    out = gzopen(outfile, mode);
    if (out == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, outfile);
        exit(1);
    }
    gz_compress(in, out);

    unlink(file);
}